

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddXcFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmListFileBacktrace *bt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  cmXcFrameworkPlistLibrary *pcVar5;
  const_iterator cVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Alloc_hider _Var7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string libraryPath;
  LinkEntry libraryEntry;
  optional<cmXcFrameworkPlist> plist;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string local_230;
  string local_210;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1f0;
  void *local_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a8 [32];
  LinkEntry local_188;
  _Optional_payload_base<cmXcFrameworkPlist> local_120;
  key_type local_e0;
  undefined1 *local_c0;
  undefined8 local_b8;
  size_type local_b0;
  pointer local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined8 local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  FeatureDescriptor *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  bt = &(entry->Item).Backtrace;
  cmParseXcFrameworkPlist
            ((optional<cmXcFrameworkPlist> *)&local_120,(string *)entry,this->Makefile,bt);
  if ((local_120._M_engaged == true) &&
     (pcVar5 = cmXcFrameworkPlist::SelectSuitableLibrary
                         ((cmXcFrameworkPlist *)&local_120,this->Makefile,bt),
     pcVar5 != (cmXcFrameworkPlistLibrary *)0x0)) {
    iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
    if ((char)iVar4 == '\0') {
      local_e0._M_string_length = (size_type)(entry->Item).Value._M_dataplus._M_p;
      local_e0._M_dataplus._M_p = (pointer)(entry->Item).Value._M_string_length;
      local_e0.field_2._M_allocated_capacity = 0;
      local_188.Item.Value.field_2._M_allocated_capacity = (long)&local_188.Item.Value.field_2 + 8;
      local_188.Item.Value._M_dataplus._M_p = (pointer)0x0;
      local_188.Item.Value._M_string_length = 1;
      local_188.Item.Value.field_2._M_local_buf[8] = '/';
      local_e0.field_2._8_8_ = 1;
      local_b8 = 0;
      local_a8 = (pcVar5->LibraryIdentifier)._M_dataplus._M_p;
      local_b0 = (pcVar5->LibraryIdentifier)._M_string_length;
      local_a0 = 0;
      local_1c0 = (void *)0x0;
      local_1b8 = 1;
      local_1a8[0] = 0x2f;
      local_98 = 1;
      local_88 = 0;
      local_78 = (pcVar5->LibraryPath)._M_dataplus._M_p;
      local_80 = (pcVar5->LibraryPath)._M_string_length;
      local_70 = 0;
      views._M_len = 5;
      views._M_array = (iterator)&local_e0;
      local_1b0 = local_1a8;
      local_c0 = (undefined1 *)local_188.Item.Value.field_2._M_allocated_capacity;
      local_90 = local_1a8;
      cmCatViews(&local_230,views);
      local_250 = &local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,
                 CONCAT44(local_230._M_dataplus._M_p._4_4_,local_230._M_dataplus._M_p._0_4_),
                 local_230._M_string_length +
                 CONCAT44(local_230._M_dataplus._M_p._4_4_,local_230._M_dataplus._M_p._0_4_));
      local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      paVar1 = &local_1f0.Value.field_2;
      if (local_250 == &local_240) {
        local_1f0.Value.field_2._8_8_ = local_240._8_8_;
        local_1f0.Value._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1f0.Value._M_dataplus._M_p = (pointer)local_250;
      }
      local_1f0.Value.field_2._M_allocated_capacity._1_7_ = local_240._M_allocated_capacity._1_7_;
      local_1f0.Value.field_2._M_local_buf[0] = local_240._M_local_buf[0];
      local_1f0.Value._M_string_length = local_248;
      local_248 = 0;
      local_240._M_local_buf[0] = '\0';
      local_250 = &local_240;
      cmComputeLinkDepends::LinkEntry::LinkEntry(&local_188,&local_1f0,entry->Target);
      if (local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0.Value._M_dataplus._M_p,
                        local_1f0.Value.field_2._M_allocated_capacity + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,
                        CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0]) +
                        1);
      }
      bVar3 = cmSystemTools::IsPathToFramework(&local_230);
      if ((bVar3) && (bVar3 = cmGeneratorTarget::IsApple(this->Target), bVar3)) {
        AddFrameworkItem(this,&local_188);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,&local_230);
        AddFullItem(this,&local_188);
        AddLibraryRuntimeInfo(this,&local_230);
        if ((pcVar5->HeadersPath)._M_string_length != 0) {
          local_e0._M_string_length = (size_type)(entry->Item).Value._M_dataplus._M_p;
          local_e0._M_dataplus._M_p = (pointer)(entry->Item).Value._M_string_length;
          local_e0.field_2._M_allocated_capacity = 0;
          local_1c0 = (void *)0x0;
          local_1b8 = 1;
          local_1a8[0] = 0x2f;
          local_e0.field_2._8_8_ = 1;
          local_b8 = 0;
          local_a8 = (pcVar5->LibraryIdentifier)._M_dataplus._M_p;
          local_b0 = (pcVar5->LibraryIdentifier)._M_string_length;
          local_a0 = 0;
          local_90 = local_50;
          local_68 = (FeatureDescriptor *)0x0;
          local_60 = 1;
          local_50[0] = 0x2f;
          local_98 = 1;
          local_88 = 0;
          local_78 = (pcVar5->HeadersPath)._M_dataplus._M_p;
          local_80 = (pcVar5->HeadersPath)._M_string_length;
          local_70 = 0;
          views_00._M_len = 5;
          views_00._M_array = (iterator)&local_e0;
          local_1b0 = local_1a8;
          local_c0 = local_1a8;
          local_58 = local_90;
          cmCatViews(&local_210,views_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->XcFrameworkHeaderPaths,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.Feature._M_dataplus._M_p != &local_188.Feature.field_2) {
        operator_delete(local_188.Feature._M_dataplus._M_p,
                        local_188.Feature.field_2._M_allocated_capacity + 1);
      }
      if (local_188.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
          TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.Item.Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.Item.Value._M_dataplus._M_p != &local_188.Item.Value.field_2) {
        operator_delete(local_188.Item.Value._M_dataplus._M_p,
                        (ulong)(local_188.Item.Value.field_2._M_allocated_capacity + 1));
      }
      _Var7._M_p = (pointer)CONCAT44(local_230._M_dataplus._M_p._4_4_,
                                     local_230._M_dataplus._M_p._0_4_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_230._M_dataplus._M_p._4_4_,local_230._M_dataplus._M_p._0_4_) ==
          &local_230.field_2) goto LAB_0047657d;
    }
    else {
      local_230._M_dataplus._M_p._0_4_ = 1;
      local_188.Item.Value._M_dataplus._M_p = (pointer)0x0;
      local_1c0 = (void *)0x0;
      __n = (entry->Feature)._M_string_length;
      if ((__n == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) &&
         ((__n == 0 ||
          (iVar4 = bcmp((entry->Feature)._M_dataplus._M_p,
                        (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,__n), iVar4 == 0)))) {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"__CMAKE_LINK_XCFRAMEWORK","");
      }
      else {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        pcVar2 = (entry->Feature)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)&local_e0,pcVar2,pcVar2 + __n);
      }
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
              ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_e0);
      local_68 = (FeatureDescriptor *)0x0;
      if ((_Rb_tree_header *)cVar6._M_node !=
          &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
        local_68 = (FeatureDescriptor *)(cVar6._M_node + 2);
      }
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
                 (ItemIsPath *)&local_230,(void **)&local_188,&local_1c0,&local_68);
      local_230.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
      _Var7._M_p = local_e0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) goto LAB_0047657d;
    }
    operator_delete(_Var7._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
LAB_0047657d:
  if (local_120._M_engaged == true) {
    std::_Optional_payload_base<cmXcFrameworkPlist>::_M_destroy(&local_120);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddXcFrameworkItem(LinkEntry const& entry)
{
  auto plist = cmParseXcFrameworkPlist(entry.Item.Value, *this->Makefile,
                                       entry.Item.Backtrace);
  if (!plist) {
    return;
  }

  if (auto const* lib =
        plist->SelectSuitableLibrary(*this->Makefile, entry.Item.Backtrace)) {
    if (this->GlobalGenerator->IsXcode()) {
      this->Items.emplace_back(
        entry.Item.Value, ItemIsPath::Yes, nullptr, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_XCFRAMEWORK"
                                   : entry.Feature));
    } else {
      auto libraryPath = cmStrCat(
        entry.Item.Value, '/', lib->LibraryIdentifier, '/', lib->LibraryPath);
      LinkEntry libraryEntry(
        BT<std::string>(libraryPath, entry.Item.Backtrace), entry.Target);

      if (cmSystemTools::IsPathToFramework(libraryPath) &&
          this->Target->IsApple()) {
        // This is a framework.
        this->AddFrameworkItem(libraryEntry);
      } else {
        this->Depends.push_back(libraryPath);
        this->AddFullItem(libraryEntry);
        this->AddLibraryRuntimeInfo(libraryPath);
        if (!lib->HeadersPath.empty()) {
          this->AddXcFrameworkHeaderPath(cmStrCat(entry.Item.Value, '/',
                                                  lib->LibraryIdentifier, '/',
                                                  lib->HeadersPath));
        }
      }
    }
  }
}